

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  vertex_t t;
  uint *puVar1;
  long *plVar2;
  pointer ppVar3;
  degree_t dVar4;
  KReach *this;
  DynamicKReach *this_00;
  ScalableKReach *this_01;
  DynamicScalableKReach *this_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  ostream *poVar6;
  vertex_t vVar7;
  long lVar8;
  long lVar9;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> (*__range1) [4];
  pair<unsigned_int,_unsigned_int> *p;
  pointer ppVar10;
  uint *puVar11;
  ulong uVar12;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> indexes [4];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  edges;
  vector<unsigned_int,_std::allocator<unsigned_int>_> out;
  Graph graph;
  vector<unsigned_int,_std::allocator<unsigned_int>_> in;
  
  Graph::Graph(&graph);
  std::__cxx11::string::string((string *)indexes,"data/sample.kreach",(allocator *)&edges);
  Graph::from_kreach(&graph,(string *)indexes);
  std::__cxx11::string::~string((string *)indexes);
  Graph::compute_degree(&graph);
  indexes[2]._M_t.super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>._M_t.
  super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>.
  super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl =
       (__uniq_ptr_data<AbstractKReach,_std::default_delete<AbstractKReach>,_true,_true>)
       (__uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>)0x0;
  indexes[3]._M_t.super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>._M_t.
  super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>.
  super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl =
       (__uniq_ptr_data<AbstractKReach,_std::default_delete<AbstractKReach>,_true,_true>)
       (__uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>)0x0;
  indexes[0]._M_t.super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>._M_t.
  super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>.
  super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl =
       (__uniq_ptr_data<AbstractKReach,_std::default_delete<AbstractKReach>,_true,_true>)
       (__uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>)0x0;
  indexes[1]._M_t.super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>._M_t.
  super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>.
  super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl =
       (__uniq_ptr_data<AbstractKReach,_std::default_delete<AbstractKReach>,_true,_true>)
       (__uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>)0x0;
  this = (KReach *)operator_new(0xb0);
  KReach::KReach(this,&graph,'\x03');
  std::__uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>::reset
            ((__uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_> *)indexes,
             (pointer)this);
  this_00 = (DynamicKReach *)operator_new(0x120);
  DynamicKReach::DynamicKReach(this_00,&graph,'\x03');
  std::__uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>::reset
            ((__uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_> *)(indexes + 1),
             (pointer)this_00);
  this_01 = (ScalableKReach *)operator_new(0x200);
  ScalableKReach::ScalableKReach(this_01,&graph,'\x03',1000,10000);
  std::__uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>::reset
            ((__uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_> *)(indexes + 2),
             (pointer)this_01);
  this_02 = (DynamicScalableKReach *)operator_new(0x338);
  DynamicScalableKReach::DynamicScalableKReach(this_02,&graph,'\x03',1000,10000);
  std::__uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>::reset
            ((__uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_> *)(indexes + 3),
             (pointer)this_02);
  for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 8) {
    (**(code **)**(undefined8 **)
                  ((long)&indexes[0]._M_t.
                          super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>
                          .super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl + lVar8))();
  }
  edges.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edges.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  edges.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar12 = 0;
  while( true ) {
    dVar4 = Graph::num_vertices(&graph);
    ppVar3 = edges.
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (dVar4 <= uVar12) break;
    pvVar5 = Graph::successors(&graph,(vertex_t)uVar12);
    puVar1 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar11 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start; puVar11 != puVar1; puVar11 = puVar11 + 1) {
      out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((ulong)*puVar11 << 0x20 | uVar12);
      std::
      vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
      ::emplace_back<std::pair<unsigned_int,unsigned_int>>
                ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                  *)&edges,(pair<unsigned_int,_unsigned_int> *)&out);
    }
    uVar12 = uVar12 + 1;
  }
  for (ppVar10 = edges.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar3; ppVar10 = ppVar10 + 1
      ) {
    vVar7 = ppVar10->first;
    t = ppVar10->second;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::endl<char,std::char_traits<char>>(poVar6);
    Graph::remove_edge(&graph,vVar7,t);
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 8) {
      plVar2 = *(long **)((long)&indexes[0]._M_t.
                                 super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>
                                 .super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl +
                         lVar8);
      (**(code **)(*plVar2 + 0x18))(plVar2,vVar7,t);
    }
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 8) {
      for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 8) {
        equals(&graph,*(AbstractKReach **)
                       ((long)&indexes[0]._M_t.
                               super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>
                               .super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl + lVar8)
               ,*(AbstractKReach **)
                 ((long)&indexes[0]._M_t.
                         super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>
                         .super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl + lVar9));
      }
    }
    Graph::insert_edge(&graph,vVar7,t);
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 8) {
      plVar2 = *(long **)((long)&indexes[0]._M_t.
                                 super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>
                                 .super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl +
                         lVar8);
      (**(code **)(*plVar2 + 0x10))(plVar2,vVar7,t);
    }
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 8) {
      for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 8) {
        equals(&graph,*(AbstractKReach **)
                       ((long)&indexes[0]._M_t.
                               super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>
                               .super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl + lVar8)
               ,*(AbstractKReach **)
                 ((long)&indexes[0]._M_t.
                         super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>
                         .super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl + lVar9));
      }
    }
  }
  uVar12 = 0;
  while( true ) {
    dVar4 = Graph::num_vertices(&graph);
    if (dVar4 <= uVar12) break;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar6);
    vVar7 = (vertex_t)uVar12;
    pvVar5 = Graph::successors(&graph,vVar7);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,pvVar5);
    pvVar5 = Graph::predecessors(&graph,vVar7);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &in.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,pvVar5);
    Graph::remove_vertex(&graph,vVar7);
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 8) {
      plVar2 = *(long **)((long)&indexes[0]._M_t.
                                 super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>
                                 .super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl +
                         lVar8);
      (**(code **)(*plVar2 + 0x20))
                (plVar2,uVar12 & 0xffffffff,
                 &out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                 &in.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 8) {
      for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 8) {
        equals(&graph,*(AbstractKReach **)
                       ((long)&indexes[0]._M_t.
                               super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>
                               .super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl + lVar8)
               ,*(AbstractKReach **)
                 ((long)&indexes[0]._M_t.
                         super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>
                         .super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl + lVar9));
      }
    }
    Graph::insert_vertex
              (&graph,vVar7,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &in.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 8) {
      plVar2 = *(long **)((long)&indexes[0]._M_t.
                                 super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>
                                 .super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl +
                         lVar8);
      (**(code **)(*plVar2 + 0x28))
                (plVar2,uVar12 & 0xffffffff,
                 &out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                 &in.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 8) {
      for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 8) {
        equals(&graph,*(AbstractKReach **)
                       ((long)&indexes[0]._M_t.
                               super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>
                               .super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl + lVar8)
               ,*(AbstractKReach **)
                 ((long)&indexes[0]._M_t.
                         super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>
                         .super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl + lVar9));
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&in.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    uVar12 = uVar12 + 1;
  }
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&edges.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  lVar8 = 0x18;
  do {
    std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::~unique_ptr
              ((unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *)
               ((long)&indexes[0]._M_t.
                       super___uniq_ptr_impl<AbstractKReach,_std::default_delete<AbstractKReach>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_AbstractKReach_*,_std::default_delete<AbstractKReach>_>
                       .super__Head_base<0UL,_AbstractKReach_*,_false>._M_head_impl + lVar8));
    lVar8 = lVar8 + -8;
  } while (lVar8 != -8);
  Graph::~Graph(&graph);
  return 0;
}

Assistant:

int main() {
    Graph graph;
    graph.from_kreach("data/sample.kreach");
    graph.compute_degree();

    unique_ptr<AbstractKReach> indexes[4];
    indexes[0].reset(new KReach(graph, 3));
    indexes[1].reset(new DynamicKReach(graph, 3));
    indexes[2].reset(new ScalableKReach(graph, 3, 1000, 10000));
    indexes[3].reset(new DynamicScalableKReach(graph, 3, 1000, 10000));

    for (auto &i : indexes){
        i->construct();
    }

    vector<pair<vertex_t, vertex_t>> edges;
    for (vertex_t s = 0; s < graph.num_vertices(); ++s) {
        for (vertex_t t : graph.successors(s)) {
            edges.push_back(make_pair(s, t));
        }
    }

    /*
     * Edge operations
     */
    for (const auto &p : edges) {
        auto s = p.first;
        auto t = p.second;
        cout << s << " " << t << endl;

        graph.remove_edge(s, t);

        for (auto &i : indexes){
            i->remove_edge(s, t);
        }
        for (const auto &i : indexes){
            for (const auto &j : indexes){
                equals(graph, *i, *j);
            }
        }

        graph.insert_edge(s, t);

        for (auto &i : indexes){
            i->insert_edge(s, t);
        }
        for (const auto &i : indexes){
            for (const auto &j : indexes){
                equals(graph, *i, *j);
            }
        }

    }

    /*
     * Vertex operations
     */
    for (vertex_t s = 0; s < graph.num_vertices(); ++s){
        cout << s << endl;
        auto out = move(graph.successors(s)), in = move(graph.predecessors(s));

        graph.remove_vertex(s);

        for (auto &i : indexes){
            i->remove_vertex(s, out, in);
        }
        for (const auto &i : indexes){
            for (const auto &j : indexes){
                equals(graph, *i, *j);
            }
        }

        graph.insert_vertex(s, out, in);

        for (auto &i : indexes){
            i->insert_vertex(s, out, in);
        }
        for (const auto &i : indexes){
            for (const auto &j : indexes){
                equals(graph, *i, *j);
            }
        }
    }

    return 0;
}